

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

float_specs
fmt::v8::detail::parse_float_type_spec<fmt::v8::detail::error_handler&,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  char cVar1;
  uint uVar2;
  uint uVar4;
  ulong uVar3;
  
  uVar4 = *(ushort *)&specs->field_0x9 >> 7 & 1;
  uVar2 = (*(ushort *)&specs->field_0x9 & 0x100) << 9 | uVar4 << 0x14;
  uVar3 = (ulong)uVar2;
  cVar1 = specs->type;
  switch(cVar1) {
  case 'A':
    uVar2 = uVar2 | 0x10000;
switchD_0011e83f_caseD_61:
    uVar3 = (ulong)(uVar2 | 3);
    break;
  case 'B':
  case 'C':
  case 'D':
switchD_0011e83f_caseD_62:
    error_handler::on_error(eh,"invalid type specifier");
  case 'E':
    uVar2 = uVar2 | 0x10000;
switchD_0011e83f_caseD_65:
    uVar3 = (ulong)((uVar2 & 0xffffe) + (uVar4 | specs->precision != 0) * 0x100000 + 1);
    break;
  case 'F':
    uVar2 = uVar2 | 0x10000;
switchD_0011e83f_caseD_66:
    uVar3 = (ulong)((uVar2 & 0xffffd) + (uVar4 | specs->precision != 0) * 0x100000 + 2);
    break;
  case 'G':
    uVar3 = (ulong)(uVar2 | 0x10000);
    break;
  default:
    switch(cVar1) {
    case 'a':
      goto switchD_0011e83f_caseD_61;
    case 'b':
    case 'c':
    case 'd':
      goto switchD_0011e83f_caseD_62;
    case 'e':
      goto switchD_0011e83f_caseD_65;
    case 'f':
      goto switchD_0011e83f_caseD_66;
    case 'g':
      break;
    default:
      if (cVar1 != '\0') goto switchD_0011e83f_caseD_62;
    }
  }
  return (float_specs)(uVar3 << 0x20);
}

Assistant:

FMT_CONSTEXPR auto parse_float_type_spec(const basic_format_specs<Char>& specs,
                                         ErrorHandler&& eh = {})
    -> float_specs {
  auto result = float_specs();
  result.showpoint = specs.alt;
  result.locale = specs.localized;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}